

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O0

QTextStream * __thiscall QTextStream::operator>>(QTextStream *this,char *c)

{
  QStringView in;
  bool bVar1;
  QTextStreamPrivate *pQVar2;
  char *pcVar3;
  undefined1 *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  char *e;
  QTextStreamPrivate *d;
  qsizetype length;
  QChar *ptr;
  QStringEncoder encoder;
  undefined4 in_stack_ffffffffffffff08;
  Status in_stack_ffffffffffffff0c;
  QTextStreamPrivate *in_stack_ffffffffffffff10;
  QChar *in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  undefined4 uVar4;
  qsizetype in_stack_ffffffffffffff40;
  storage_type_conflict *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff68;
  TokenDelimiter delimiter;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype *in_stack_ffffffffffffff78;
  QChar **in_stack_ffffffffffffff80;
  QTextStreamPrivate *in_stack_ffffffffffffff88;
  QMessageLogger local_68;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  delimiter = (TokenDelimiter)((ulong)in_stack_ffffffffffffff68 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QTextStream *)0x4ab635);
  *in_RSI = 0;
  if ((pQVar2->string == (QString *)0x0) && (pQVar2->device == (QIODevice *)0x0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
               (char *)in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20),
               (char *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    QMessageLogger::warning(&local_68,"QTextStream: No device");
  }
  else {
    QTextStreamPrivate::scan
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffff70,delimiter);
    QTextStreamPrivate::consumeLastToken(in_stack_ffffffffffffff10);
    bVar1 = QTextStreamPrivate::scan
                      ((QTextStreamPrivate *)&DAT_aaaaaaaaaaaaaaaa,in_stack_ffffffffffffff80,
                       in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,delimiter);
    if (bVar1) {
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      uVar4 = 0;
      QFlags<QStringConverterBase::Flag>::QFlags
                ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff0c);
      QStringEncoder::QStringEncoder
                ((QStringEncoder *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                 (QFlagsStorageHelper<QStringConverterBase::Flag,_4>)
                 SUB84((ulong)in_stack_ffffffffffffff18 >> 0x20,0));
      QStringView::QStringView<QChar,_true>
                ((QStringView *)CONCAT44(uVar4,in_stack_ffffffffffffff20),in_stack_ffffffffffffff18,
                 (qsizetype)in_stack_ffffffffffffff10);
      in.m_data = in_stack_ffffffffffffff48;
      in.m_size = in_stack_ffffffffffffff40;
      pcVar3 = QStringEncoder::appendToBuffer
                         ((QStringEncoder *)CONCAT44(uVar4,in_stack_ffffffffffffff20),
                          (char *)in_stack_ffffffffffffff18,in);
      *pcVar3 = '\0';
      QTextStreamPrivate::consumeLastToken(in_stack_ffffffffffffff10);
      QStringEncoder::~QStringEncoder((QStringEncoder *)0x4ab7f5);
    }
    else {
      setStatus((QTextStream *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream &QTextStream::operator>>(char *c)
{
    Q_D(QTextStream);
    *c = 0;
    CHECK_VALID_STREAM(*this);
    d->scan(nullptr, nullptr, 0, QTextStreamPrivate::NotSpace);
    d->consumeLastToken();

    const QChar *ptr;
    qsizetype length;
    if (!d->scan(&ptr, &length, 0, QTextStreamPrivate::Space)) {
        setStatus(ReadPastEnd);
        return *this;
    }

    QStringEncoder encoder(QStringConverter::Utf8);
    char *e = encoder.appendToBuffer(c, QStringView(ptr, length));
    *e = '\0';
    d->consumeLastToken();
    return *this;
}